

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::outputStyleBinary(Binasc *this,ostream *out,istream *input)

{
  uint uVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar1 = std::istream::get();
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
      return 1;
    }
    iVar3 = 0;
    do {
      if ((uVar1 & 0xff) < 0x10) {
        uStack_38._0_6_ = CONCAT15(0x30,(undefined5)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 5),1);
      }
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,uVar1 & 0xff);
      uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 6),1);
      iVar3 = iVar3 + 1;
      if (this->m_maxLineBytes <= iVar3) {
        uStack_38 = CONCAT17(10,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 7),1);
        iVar3 = 0;
      }
      uVar1 = std::istream::get();
    } while (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0);
    iVar4 = 1;
    if (iVar3 == 0) {
      return 1;
    }
  }
  else {
    out = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"End of the file right away!",0x1b);
    iVar4 = 0;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return iVar4;
}

Assistant:

int Binasc::outputStyleBinary(std::ostream& out, std::istream& input) {
	int currentByte = 0;    // current byte output in line
	uchar ch;               // current input byte

	ch = static_cast<uchar>(input.get());
	if (input.eof()) {
		std::cerr << "End of the file right away!" << std::endl;
		return 0;
	}

	while (!input.eof()) {
		if (ch < 0x10) {
			out << '0';
		}
		out << std::hex << (int)ch << ' ';
		currentByte++;
		if (currentByte >= m_maxLineBytes) {
			out << '\n';
			currentByte = 0;
		}
		ch = static_cast<uchar>(input.get());
	}

	if (currentByte != 0) {
		out << std::endl;
	}

	return 1;
}